

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O1

void __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::VBInt>::dump
          (Property<Protocol::MQTT::Common::VBInt> *this,FastString *out,int indent)

{
  ulong uVar1;
  undefined8 uVar2;
  String local_30;
  
  uVar1 = (ulong)(this->super_PropertyBase).type;
  if ((uVar1 < 0x2b) && ((0x16811f4f1U >> (uVar1 & 0x3f) & 1) == 0)) {
    uVar2 = *(undefined8 *)
             (PrivateRegistry::getPropertyName(unsigned_char)::propertyMap +
             (ulong)(byte)PrivateRegistry::invPropertyMap[uVar1] * 8);
  }
  else {
    uVar2 = 0;
  }
  MQTTStringPrintf((char *)&local_30,"%*sType %s\n",(ulong)(uint)indent,"",uVar2);
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::VBInt::dump(&this->value,out,indent + 2);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    value.dump(out, indent + 2);
                }